

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O0

result<toml::detail::region,_toml::detail::none_t> *
toml::detail::
sequence<toml::detail::character<'U'>,_toml::detail::repeat<toml::detail::either<toml::detail::in_range<'0',_'9'>,_toml::detail::in_range<'A',_'F'>,_toml::detail::in_range<'a',_'f'>_>,_toml::detail::exactly<8UL>_>_>
::invoke(result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,location *loc)

{
  bool bVar1;
  value_type *pvVar2;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> in_R8;
  location local_d8;
  undefined4 local_90;
  failure_type local_79;
  const_iterator local_78;
  undefined1 local_70 [8];
  result<toml::detail::region,_toml::detail::none_t> rslt;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first;
  location *loc_local;
  
  rslt.field_1.succ.value.last_._M_current = location::iter(loc);
  character<'U'>::invoke((result<toml::detail::region,_toml::detail::none_t> *)local_70,loc);
  bVar1 = result<toml::detail::region,_toml::detail::none_t>::is_err
                    ((result<toml::detail::region,_toml::detail::none_t> *)local_70);
  if (bVar1) {
    local_78._M_current = (char *)rslt.field_1.succ.value.last_._M_current;
    location::reset(loc,rslt.field_1.succ.value.last_._M_current);
    none();
    result<toml::detail::region,_toml::detail::none_t>::result(__return_storage_ptr__,&local_79);
  }
  else {
    pvVar2 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                       ((result<toml::detail::region,_toml::detail::none_t> *)local_70);
    region::region((region *)&local_d8,pvVar2);
    sequence<toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<8ul>>>
    ::invoke<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              (__return_storage_ptr__,
               (sequence<toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<8ul>>>
                *)loc,&local_d8,(region *)rslt.field_1.succ.value.last_._M_current,in_R8);
    region::~region((region *)&local_d8);
  }
  local_90 = 1;
  result<toml::detail::region,_toml::detail::none_t>::~result
            ((result<toml::detail::region,_toml::detail::none_t> *)local_70);
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc)
    {
        const auto first = loc.iter();
        auto rslt = Head::invoke(loc);
        if(rslt.is_err())
        {
            loc.reset(first);
            return none();
        }
        return sequence<Tail...>::invoke(loc, std::move(rslt.unwrap()), first);
    }